

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O2

string * Imf_3_4::insertViewName
                   (string *__return_storage_ptr__,string *channel,StringVector *multiView,int i)

{
  ulong uVar1;
  char c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long lVar2;
  ulong uVar3;
  StringVector s;
  StringVector local_b0;
  StringVector *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = multiView;
  std::__cxx11::string::string((string *)&local_70,(string *)channel);
  anon_unknown_5::parseString(&local_b0,&local_70,c);
  std::__cxx11::string::~string((string *)&local_70);
  if (local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_90);
  }
  else if ((i == 0) &&
          ((long)local_b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0x20)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)channel);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    lVar2 = 0;
    for (uVar3 = 0;
        uVar1 = (long)local_b0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_b0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5, uVar3 < uVar1;
        uVar3 = uVar3 + 1) {
      if (uVar3 < uVar1 - 1) {
        std::operator+(&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((local_b0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar2),".");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        this = &local_90;
      }
      else {
        std::operator+(&local_50,
                       (local_98->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + i,".");
        std::operator+(&local_90,&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((local_b0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar2));
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
        this = &local_50;
      }
      std::__cxx11::string::~string((string *)this);
      lVar2 = lVar2 + 0x20;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

string
insertViewName (const string& channel, const StringVector& multiView, int i)
{
    //
    // Insert multiView[i] into the channel name if appropriate.
    //

    StringVector s = parseString (channel, '.');

    if (s.size () == 0) return ""; // nothing in, nothing out

    if (s.size () == 1 && i == 0)
    {
        //
        // Channel in the default view, with no periods in its name.
        // Do not insert view name.
        //

        return channel;
    }

    //
    // View name becomes penultimate section of new channel name.
    //

    string newName;

    for (size_t j = 0; j < s.size (); ++j)
    {
        if (j < s.size () - 1)
            newName += s[j] + ".";
        else
            newName += multiView[i] + "." + s[j];
    }

    return newName;
}